

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qslider.cpp
# Opt level: O0

SubControl __thiscall QSliderPrivate::newHoverControl(QSliderPrivate *this,QPoint *pos)

{
  QSlider *pQVar1;
  QStyle *pQVar2;
  ulong uVar3;
  bool in_SIL;
  QSliderPrivate *in_RDI;
  long in_FS_OFFSET;
  QSlider *q;
  QRect tickmarksRect;
  QRect grooveRect;
  QRect handleRect;
  QStyleOptionSlider opt;
  undefined4 in_stack_ffffffffffffff08;
  SubControl in_stack_ffffffffffffff0c;
  SubControl SVar4;
  undefined8 local_cc;
  undefined8 local_c4;
  undefined1 local_bc [16];
  undefined1 local_ac [16];
  undefined1 local_9c [16];
  undefined4 local_8c;
  undefined1 local_88 [64];
  undefined4 local_48;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = q_func(in_RDI);
  memcpy(local_88,&DAT_00b22868,0x80);
  QStyleOptionSlider::QStyleOptionSlider((QStyleOptionSlider *)0x6829da);
  (**(code **)(*(long *)&(pQVar1->super_QAbstractSlider).super_QWidget + 0x1a8))(pQVar1,local_88);
  QFlags<QStyle::SubControl>::QFlags((QFlags<QStyle::SubControl> *)in_RDI,in_stack_ffffffffffffff0c)
  ;
  local_48 = local_8c;
  local_9c._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_9c._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pQVar2 = QWidget::style((QWidget *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  local_9c = (**(code **)(*(long *)pQVar2 + 0xd8))(pQVar2,3,local_88,2,pQVar1);
  local_ac._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_ac._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pQVar2 = QWidget::style((QWidget *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  local_ac = (**(code **)(*(long *)pQVar2 + 0xd8))(pQVar2,3,local_88,1,pQVar1);
  local_bc._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_bc._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pQVar2 = QWidget::style((QWidget *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  local_bc = (**(code **)(*(long *)pQVar2 + 0xd8))(pQVar2,3,local_88,4,pQVar1);
  uVar3 = QRect::contains((QPoint *)local_9c,in_SIL);
  if ((uVar3 & 1) == 0) {
    uVar3 = QRect::contains((QPoint *)local_ac,in_SIL);
    if ((uVar3 & 1) == 0) {
      uVar3 = QRect::contains((QPoint *)local_bc,in_SIL);
      if ((uVar3 & 1) == 0) {
        QRect::QRect((QRect *)in_RDI);
        (in_RDI->hoverRect).x1 = (Representation)(undefined4)local_cc;
        (in_RDI->hoverRect).y1 = (Representation)local_cc._4_4_;
        (in_RDI->hoverRect).x2 = (Representation)(undefined4)local_c4;
        (in_RDI->hoverRect).y2 = (Representation)local_c4._4_4_;
        in_RDI->hoverControl = SC_None;
      }
      else {
        (in_RDI->hoverRect).x1 = (Representation)local_bc._0_4_;
        (in_RDI->hoverRect).y1 = (Representation)local_bc._4_4_;
        (in_RDI->hoverRect).x2 = (Representation)local_bc._8_4_;
        (in_RDI->hoverRect).y2 = (Representation)local_bc._12_4_;
        in_RDI->hoverControl = SC_ComboBoxArrow;
      }
    }
    else {
      (in_RDI->hoverRect).x1 = (Representation)local_ac._0_4_;
      (in_RDI->hoverRect).y1 = (Representation)local_ac._4_4_;
      (in_RDI->hoverRect).x2 = (Representation)local_ac._8_4_;
      (in_RDI->hoverRect).y2 = (Representation)local_ac._12_4_;
      in_RDI->hoverControl = SC_ComboBoxFrame;
    }
  }
  else {
    (in_RDI->hoverRect).x1 = (Representation)local_9c._0_4_;
    (in_RDI->hoverRect).y1 = (Representation)local_9c._4_4_;
    (in_RDI->hoverRect).x2 = (Representation)local_9c._8_4_;
    (in_RDI->hoverRect).y2 = (Representation)local_9c._12_4_;
    in_RDI->hoverControl = SC_ComboBoxEditField;
  }
  SVar4 = in_RDI->hoverControl;
  QStyleOptionSlider::~QStyleOptionSlider((QStyleOptionSlider *)0x682bfc);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return SVar4;
}

Assistant:

QStyle::SubControl QSliderPrivate::newHoverControl(const QPoint &pos)
{
    Q_Q(QSlider);
    QStyleOptionSlider opt;
    q->initStyleOption(&opt);
    opt.subControls = QStyle::SC_All;
    QRect handleRect = q->style()->subControlRect(QStyle::CC_Slider, &opt, QStyle::SC_SliderHandle, q);
    QRect grooveRect = q->style()->subControlRect(QStyle::CC_Slider, &opt, QStyle::SC_SliderGroove, q);
    QRect tickmarksRect = q->style()->subControlRect(QStyle::CC_Slider, &opt, QStyle::SC_SliderTickmarks, q);

    if (handleRect.contains(pos)) {
        hoverRect = handleRect;
        hoverControl = QStyle::SC_SliderHandle;
    } else if (grooveRect.contains(pos)) {
        hoverRect = grooveRect;
        hoverControl = QStyle::SC_SliderGroove;
    } else if (tickmarksRect.contains(pos)) {
        hoverRect = tickmarksRect;
        hoverControl = QStyle::SC_SliderTickmarks;
    } else {
        hoverRect = QRect();
        hoverControl = QStyle::SC_None;
    }

    return hoverControl;
}